

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O0

SPxId __thiscall
soplex::SPxDefaultRT<double>::selectEnter
          (SPxDefaultRT<double> *this,double *max,int param_3,bool param_4)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  UpdateVector<double> *pUVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  double *pdVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  char *pcVar7;
  double *pdVar8;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  DataKey DVar9;
  undefined1 in_CL;
  undefined4 in_EDX;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  SPxDefaultRT<double> *in_RSI;
  SPxDefaultRT<double> *in_RDI;
  _func_int **pp_Var10;
  double y_7;
  double y_6;
  double y_5;
  double y_4;
  double y_3;
  double y_2;
  double y_1;
  double y;
  double x;
  int j;
  int i;
  SPxId enterId;
  int cnum;
  int pnum;
  double val;
  double epsilon;
  double *ucb;
  double *lcb;
  IdxSet *cidx;
  double *cupd;
  double *cvec;
  double *upb;
  double *lpb;
  IdxSet *pidx;
  double *pupd;
  double *pvec;
  double local_1a8;
  double local_1a0;
  double in_stack_fffffffffffffe68;
  int n;
  SSVectorBase<double> *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe7c;
  SPxSolverBase<double> *in_stack_fffffffffffffe80;
  double local_168;
  double local_160;
  uint local_98;
  DataKey local_90;
  uint local_88;
  uint local_84;
  _func_int **local_80;
  double local_78;
  double *local_70;
  double *local_68;
  IdxSet *local_60;
  double *local_58;
  double *local_50;
  double *local_48;
  double *local_40;
  IdxSet *local_38;
  double *local_30;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar11;
  
  uVar11 = CONCAT13(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffff;
  iVar4 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  pUVar5 = SPxSolverBase<double>::coPvec((SPxSolverBase<double> *)CONCAT44(extraout_var,iVar4));
  UpdateVector<double>::delta(pUVar5);
  SSVectorBase<double>::setup(in_stack_fffffffffffffe70);
  iVar4 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  pUVar5 = SPxSolverBase<double>::pVec((SPxSolverBase<double> *)CONCAT44(extraout_var_00,iVar4));
  UpdateVector<double>::delta(pUVar5);
  SSVectorBase<double>::setup(in_stack_fffffffffffffe70);
  iVar4 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  SPxSolverBase<double>::pVec((SPxSolverBase<double> *)CONCAT44(extraout_var_01,iVar4));
  pdVar6 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2b379b);
  iVar4 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  pUVar5 = SPxSolverBase<double>::pVec((SPxSolverBase<double> *)CONCAT44(extraout_var_02,iVar4));
  UpdateVector<double>::delta(pUVar5);
  local_30 = SSVectorBase<double>::values((SSVectorBase<double> *)0x2b37c9);
  iVar4 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  SPxSolverBase<double>::pVec((SPxSolverBase<double> *)CONCAT44(extraout_var_03,iVar4));
  local_38 = UpdateVector<double>::idx((UpdateVector<double> *)0x2b37ef);
  iVar4 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  SPxSolverBase<double>::lpBound((SPxSolverBase<double> *)CONCAT44(extraout_var_04,iVar4));
  local_40 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2b3815);
  iVar4 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  SPxSolverBase<double>::upBound((SPxSolverBase<double> *)CONCAT44(extraout_var_05,iVar4));
  local_48 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2b383b);
  iVar4 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  SPxSolverBase<double>::coPvec((SPxSolverBase<double> *)CONCAT44(extraout_var_06,iVar4));
  local_50 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2b3861);
  iVar4 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  pUVar5 = SPxSolverBase<double>::coPvec((SPxSolverBase<double> *)CONCAT44(extraout_var_07,iVar4));
  UpdateVector<double>::delta(pUVar5);
  local_58 = SSVectorBase<double>::values((SSVectorBase<double> *)0x2b388f);
  iVar4 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  SPxSolverBase<double>::coPvec((SPxSolverBase<double> *)CONCAT44(extraout_var_08,iVar4));
  local_60 = UpdateVector<double>::idx((UpdateVector<double> *)0x2b38b5);
  iVar4 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  SPxSolverBase<double>::lcBound((SPxSolverBase<double> *)CONCAT44(extraout_var_09,iVar4));
  local_68 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2b38db);
  iVar4 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  SPxSolverBase<double>::ucBound((SPxSolverBase<double> *)CONCAT44(extraout_var_10,iVar4));
  local_70 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2b3901);
  (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  local_78 = SPxSolverBase<double>::epsilon((SPxSolverBase<double> *)0x2b391f);
  local_80 = (in_RSI->super_SPxRatioTester<double>)._vptr_SPxRatioTester;
  local_84 = 0xffffffff;
  local_88 = 0xffffffff;
  SPxId::SPxId((SPxId *)0x2b3960);
  if ((double)local_80 <= 0.0) {
    for (local_98 = 0; iVar4 = IdxSet::size(local_38), (int)local_98 < iVar4;
        local_98 = local_98 + 1) {
      pcVar7 = IdxSet::index(local_38,(char *)(ulong)local_98,__c_01);
      iVar4 = (int)pcVar7;
      dVar1 = local_30[iVar4];
      if (dVar1 <= local_78) {
        if (dVar1 < -local_78) {
          in_stack_fffffffffffffe80 = (SPxSolverBase<double> *)local_48[iVar4];
          pdVar8 = (double *)infinity();
          if (((double)in_stack_fffffffffffffe80 < *pdVar8) &&
             (pp_Var10 = (_func_int **)
                         (((local_48[iVar4] - pdVar6[iVar4]) +
                          (in_RDI->super_SPxRatioTester<double>).delta) / dVar1),
             (double)local_80 < (double)pp_Var10)) {
            (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
            local_90 = (DataKey)SPxSolverBase<double>::id
                                          ((SPxSolverBase<double> *)
                                           CONCAT44(in_stack_fffffffffffffe7c,
                                                    in_stack_fffffffffffffe78),
                                           (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
            local_84 = local_98;
            local_80 = pp_Var10;
          }
        }
      }
      else {
        dVar2 = local_40[iVar4];
        pdVar8 = (double *)infinity();
        if ((-*pdVar8 < dVar2) &&
           (pp_Var10 = (_func_int **)
                       (((local_40[iVar4] - pdVar6[iVar4]) -
                        (in_RDI->super_SPxRatioTester<double>).delta) / dVar1),
           (double)local_80 < (double)pp_Var10)) {
          (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
          local_90 = (DataKey)SPxSolverBase<double>::id
                                        ((SPxSolverBase<double> *)
                                         CONCAT44(in_stack_fffffffffffffe7c,
                                                  in_stack_fffffffffffffe78),
                                         (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
          local_84 = local_98;
          local_80 = pp_Var10;
        }
      }
    }
    local_98 = 0;
    while( true ) {
      in_stack_fffffffffffffe7c = local_98;
      iVar4 = IdxSet::size(local_60);
      n = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
      if (iVar4 <= (int)in_stack_fffffffffffffe7c) break;
      pcVar7 = IdxSet::index(local_60,(char *)(ulong)local_98,__c_02);
      iVar4 = (int)pcVar7;
      dVar1 = local_58[iVar4];
      if (dVar1 <= local_78) {
        if (dVar1 < -local_78) {
          in_stack_fffffffffffffe68 = local_70[iVar4];
          pdVar8 = (double *)infinity();
          if ((in_stack_fffffffffffffe68 < *pdVar8) &&
             (pp_Var10 = (_func_int **)
                         (((local_70[iVar4] - local_50[iVar4]) +
                          (in_RDI->super_SPxRatioTester<double>).delta) / dVar1),
             (double)local_80 < (double)pp_Var10)) {
            (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
            local_90 = (DataKey)SPxSolverBase<double>::coId
                                          ((SPxSolverBase<double> *)
                                           CONCAT44(in_stack_fffffffffffffe7c,
                                                    in_stack_fffffffffffffe78),
                                           (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
            local_88 = local_98;
            local_80 = pp_Var10;
          }
        }
      }
      else {
        in_stack_fffffffffffffe70 = (SSVectorBase<double> *)local_68[iVar4];
        pdVar8 = (double *)infinity();
        if ((-*pdVar8 < (double)in_stack_fffffffffffffe70) &&
           (pp_Var10 = (_func_int **)
                       (((local_68[iVar4] - local_50[iVar4]) -
                        (in_RDI->super_SPxRatioTester<double>).delta) / dVar1),
           (double)local_80 < (double)pp_Var10)) {
          (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
          local_90 = (DataKey)SPxSolverBase<double>::coId
                                        ((SPxSolverBase<double> *)
                                         CONCAT44(in_stack_fffffffffffffe7c,
                                                  in_stack_fffffffffffffe78),
                                         (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
          local_88 = local_98;
          local_80 = pp_Var10;
        }
      }
      local_98 = local_98 + 1;
    }
    if ((int)local_88 < 0) {
      if (-1 < (int)local_84) {
        pcVar7 = IdxSet::index(local_38,(char *)(ulong)local_84,__c_02);
        iVar4 = (int)pcVar7;
        if (local_78 <= local_30[iVar4]) {
          local_1a8 = local_40[iVar4];
        }
        else {
          local_1a8 = local_48[iVar4];
        }
        local_80 = (_func_int **)((local_1a8 - pdVar6[iVar4]) / local_30[iVar4]);
      }
    }
    else {
      pcVar7 = IdxSet::index(local_60,(char *)(ulong)local_88,__c_02);
      iVar4 = (int)pcVar7;
      if (local_78 <= local_58[iVar4]) {
        local_1a0 = local_68[iVar4];
      }
      else {
        local_1a0 = local_70[iVar4];
      }
      local_80 = (_func_int **)((local_1a0 - local_50[iVar4]) / local_58[iVar4]);
    }
  }
  else {
    for (local_98 = 0; iVar4 = IdxSet::size(local_38), (int)local_98 < iVar4;
        local_98 = local_98 + 1) {
      pcVar7 = IdxSet::index(local_38,(char *)(ulong)local_98,__c);
      iVar4 = (int)pcVar7;
      dVar1 = local_30[iVar4];
      if (dVar1 <= local_78) {
        if (((dVar1 < -local_78) &&
            (dVar2 = local_40[iVar4], pdVar8 = (double *)infinity(), -*pdVar8 < dVar2)) &&
           (pp_Var10 = (_func_int **)
                       (((local_40[iVar4] - pdVar6[iVar4]) -
                        (in_RDI->super_SPxRatioTester<double>).delta) / dVar1),
           (double)pp_Var10 < (double)local_80)) {
          (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
          local_90 = (DataKey)SPxSolverBase<double>::id
                                        ((SPxSolverBase<double> *)
                                         CONCAT44(in_stack_fffffffffffffe7c,
                                                  in_stack_fffffffffffffe78),
                                         (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
          local_84 = local_98;
          local_80 = pp_Var10;
        }
      }
      else {
        dVar2 = local_48[iVar4];
        pdVar8 = (double *)infinity();
        if ((dVar2 < *pdVar8) &&
           (pp_Var10 = (_func_int **)
                       (((local_48[iVar4] - pdVar6[iVar4]) +
                        (in_RDI->super_SPxRatioTester<double>).delta) / dVar1),
           (double)pp_Var10 < (double)local_80)) {
          (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
          local_90 = (DataKey)SPxSolverBase<double>::id
                                        ((SPxSolverBase<double> *)
                                         CONCAT44(in_stack_fffffffffffffe7c,
                                                  in_stack_fffffffffffffe78),
                                         (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
          local_84 = local_98;
          local_80 = pp_Var10;
        }
      }
    }
    local_98 = 0;
    while( true ) {
      iVar4 = IdxSet::size(local_60);
      n = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
      if (iVar4 <= (int)local_98) break;
      pcVar7 = IdxSet::index(local_60,(char *)(ulong)local_98,__c_00);
      iVar4 = (int)pcVar7;
      dVar1 = local_58[iVar4];
      if (dVar1 <= local_78) {
        if (((dVar1 < -local_78) &&
            (dVar2 = local_68[iVar4], pdVar8 = (double *)infinity(), -*pdVar8 < dVar2)) &&
           (pp_Var10 = (_func_int **)
                       (((local_68[iVar4] - local_50[iVar4]) -
                        (in_RDI->super_SPxRatioTester<double>).delta) / dVar1),
           (double)pp_Var10 < (double)local_80)) {
          (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
          local_90 = (DataKey)SPxSolverBase<double>::coId
                                        ((SPxSolverBase<double> *)
                                         CONCAT44(in_stack_fffffffffffffe7c,
                                                  in_stack_fffffffffffffe78),
                                         (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
          local_88 = local_98;
          local_80 = pp_Var10;
        }
      }
      else {
        dVar2 = local_70[iVar4];
        pdVar8 = (double *)infinity();
        if ((dVar2 < *pdVar8) &&
           (pp_Var10 = (_func_int **)
                       (((local_70[iVar4] - local_50[iVar4]) +
                        (in_RDI->super_SPxRatioTester<double>).delta) / dVar1),
           (double)pp_Var10 < (double)local_80)) {
          (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
          local_90 = (DataKey)SPxSolverBase<double>::coId
                                        ((SPxSolverBase<double> *)
                                         CONCAT44(in_stack_fffffffffffffe7c,
                                                  in_stack_fffffffffffffe78),
                                         (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
          local_88 = local_98;
          local_80 = pp_Var10;
        }
      }
      local_98 = local_98 + 1;
    }
    if ((int)local_88 < 0) {
      if (-1 < (int)local_84) {
        pcVar7 = IdxSet::index(local_38,(char *)(ulong)local_84,__c_00);
        iVar4 = (int)pcVar7;
        if (local_30[iVar4] <= local_78) {
          local_168 = local_40[iVar4];
        }
        else {
          local_168 = local_48[iVar4];
        }
        local_80 = (_func_int **)((local_168 - pdVar6[iVar4]) / local_30[iVar4]);
      }
    }
    else {
      pcVar7 = IdxSet::index(local_60,(char *)(ulong)local_88,__c_00);
      iVar4 = (int)pcVar7;
      if (local_58[iVar4] <= local_78) {
        local_160 = local_68[iVar4];
      }
      else {
        local_160 = local_70[iVar4];
      }
      local_80 = (_func_int **)((local_160 - local_50[iVar4]) / local_58[iVar4]);
    }
  }
  bVar3 = SPxId::isValid((SPxId *)&local_90);
  if (bVar3) {
    (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
    bVar3 = SPxSolverBase<double>::isBasic
                      (in_stack_fffffffffffffe80,
                       (SPxId *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    if (bVar3) {
      SPxOut::debug<soplex::SPxDefaultRT<double>,_const_char_(&)[41],_double_&,_0>
                (in_RDI,(char (*) [41])"DDEFRT01 isValid() && isBasic(): max={}\n",(double *)in_RSI)
      ;
      if ((int)local_88 < 0) {
        if (-1 < (int)local_84) {
          iVar4 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
          pUVar5 = SPxSolverBase<double>::pVec
                             ((SPxSolverBase<double> *)CONCAT44(extraout_var_12,iVar4));
          UpdateVector<double>::delta(pUVar5);
          SSVectorBase<double>::clearNum(in_stack_fffffffffffffe70,n);
        }
      }
      else {
        iVar4 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
        pUVar5 = SPxSolverBase<double>::coPvec
                           ((SPxSolverBase<double> *)CONCAT44(extraout_var_11,iVar4));
        UpdateVector<double>::delta(pUVar5);
        SSVectorBase<double>::clearNum(in_stack_fffffffffffffe70,n);
      }
      DVar9 = (DataKey)selectEnter(in_RSI,(double *)CONCAT44(in_EDX,uVar11),
                                   (int)((ulong)pdVar6 >> 0x20),SUB81((ulong)pdVar6 >> 0x18,0));
      return (SPxId)DVar9;
    }
  }
  (in_RSI->super_SPxRatioTester<double>)._vptr_SPxRatioTester = local_80;
  return (SPxId)local_90;
}

Assistant:

SPxId SPxDefaultRT<R>::selectEnter(R& max, int, bool)
{
   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   const R*   pvec = this->solver()->pVec().get_const_ptr();
   const R*   pupd = this->solver()->pVec().delta().values();
   const IdxSet& pidx = this->solver()->pVec().idx();
   const R*   lpb  = this->solver()->lpBound().get_const_ptr();
   const R*   upb  = this->solver()->upBound().get_const_ptr();

   const R*   cvec = this->solver()->coPvec().get_const_ptr();
   const R*   cupd = this->solver()->coPvec().delta().values();
   const IdxSet& cidx = this->solver()->coPvec().idx();
   const R*   lcb  = this->solver()->lcBound().get_const_ptr();
   const R*   ucb  = this->solver()->ucBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   R val     = max;
   int  pnum    = -1;
   int  cnum    = -1;

   SPxId enterId;
   int   i;
   int   j;
   R  x;

   // PARALLEL the j loops could be parallelized
   if(val > 0)
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x > epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x > epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }
   else
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x < epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x < epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }

   if(enterId.isValid() && this->solver()->isBasic(enterId))
   {
      SPxOut::debug(this, "DDEFRT01 isValid() && isBasic(): max={}\n", max);

      if(cnum >= 0)
         this->solver()->coPvec().delta().clearNum(cnum);
      else if(pnum >= 0)
         this->solver()->pVec().delta().clearNum(pnum);

      return SPxDefaultRT<R>::selectEnter(max, 0, false);
   }

   SPX_DEBUG(

      if(!enterId.isValid())
      std::cout << "DDEFRT02 !isValid(): max=" << max << ", x=" << x << std::endl;
   )
      max = val;

   return enterId;
}